

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O0

void cb_template_name(Fl_Input *param_1,void *param_2)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  void *param_1_local;
  Fl_Input *param_0_local;
  
  __s = Fl_Input_::value(&template_name->super_Fl_Input_);
  sVar2 = strlen(__s);
  if (sVar2 == 0) {
    Fl_Widget::deactivate((Fl_Widget *)template_submit);
  }
  else {
    Fl_Widget::activate((Fl_Widget *)template_submit);
    iVar1 = Fl::event_key();
    if (iVar1 == 0xff0d) {
      (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
    }
  }
  return;
}

Assistant:

static void cb_template_name(Fl_Input*, void*) {
  if (strlen(template_name->value())) {
  template_submit->activate();
  if (Fl::event_key() == FL_Enter) template_panel->hide();
} else template_submit->deactivate();
}